

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cc
# Opt level: O1

void benchmark::ReplaceAll(string *str,string *from,string *to)

{
  ulong uVar1;
  
  for (uVar1 = std::__cxx11::string::find((char *)str,(ulong)(from->_M_dataplus)._M_p,0);
      uVar1 != 0xffffffffffffffff;
      uVar1 = std::__cxx11::string::find
                        ((char *)str,(ulong)(from->_M_dataplus)._M_p,uVar1 + to->_M_string_length))
  {
    std::__cxx11::string::replace
              ((ulong)str,uVar1,(char *)from->_M_string_length,(ulong)(to->_M_dataplus)._M_p);
  }
  return;
}

Assistant:

void ReplaceAll(std::string* str, const std::string& from,
                const std::string& to) {
  std::size_t start = 0;
  while((start = str->find(from, start)) != std::string::npos) {
    str->replace(start, from.length(), to);
    start += to.length();
  }
}